

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_7_channels_with_n_coeffs_mod2
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar18 = horizontal_coefficients + 4;
  do {
    lVar19 = (long)(horizontal_contributors->n0 * 7);
    pfVar16 = decode_buffer + lVar19;
    fVar29 = *horizontal_coefficients;
    fVar37 = horizontal_coefficients[1];
    fVar30 = horizontal_coefficients[2];
    fVar2 = horizontal_coefficients[3];
    fVar22 = pfVar16[0xe] * fVar30 + *pfVar16 * fVar29;
    fVar23 = pfVar16[0xf] * fVar30 + pfVar16[1] * fVar29;
    fVar24 = pfVar16[0x10] * fVar30 + pfVar16[2] * fVar29;
    fVar25 = pfVar16[0x11] * fVar30 + pfVar16[3] * fVar29;
    fVar26 = pfVar16[0x11] * fVar30 + pfVar16[3] * fVar29;
    fVar27 = pfVar16[0x12] * fVar30 + pfVar16[4] * fVar29;
    fVar28 = pfVar16[0x13] * fVar30 + pfVar16[5] * fVar29;
    fVar29 = pfVar16[0x14] * fVar30 + pfVar16[6] * fVar29;
    fVar30 = pfVar16[0x15] * fVar2 + pfVar16[7] * fVar37;
    fVar31 = pfVar16[0x16] * fVar2 + pfVar16[8] * fVar37;
    fVar32 = pfVar16[0x17] * fVar2 + pfVar16[9] * fVar37;
    fVar33 = pfVar16[0x18] * fVar2 + pfVar16[10] * fVar37;
    fVar34 = pfVar16[0x18] * fVar2 + fVar37 * pfVar16[10];
    fVar35 = pfVar16[0x19] * fVar2 + fVar37 * pfVar16[0xb];
    fVar36 = pfVar16[0x1a] * fVar2 + fVar37 * pfVar16[0xc];
    fVar37 = pfVar16[0x1b] * fVar2 + fVar37 * pfVar16[0xd];
    iVar17 = ((horizontal_contributors->n1 - horizontal_contributors->n0) + -2 >> 2) + 1;
    pfVar16 = decode_buffer + lVar19 + 0x1c;
    pfVar21 = pfVar18;
    do {
      pfVar20 = pfVar16;
      fVar2 = *pfVar21;
      fVar3 = pfVar21[1];
      fVar4 = pfVar21[2];
      fVar5 = pfVar21[3];
      fVar22 = pfVar20[0xe] * fVar4 + *pfVar20 * fVar2 + fVar22;
      fVar23 = pfVar20[0xf] * fVar4 + pfVar20[1] * fVar2 + fVar23;
      fVar24 = pfVar20[0x10] * fVar4 + pfVar20[2] * fVar2 + fVar24;
      fVar25 = pfVar20[0x11] * fVar4 + pfVar20[3] * fVar2 + fVar25;
      fVar26 = pfVar20[0x11] * fVar4 + pfVar20[3] * fVar2 + fVar26;
      fVar27 = pfVar20[0x12] * fVar4 + pfVar20[4] * fVar2 + fVar27;
      fVar28 = pfVar20[0x13] * fVar4 + pfVar20[5] * fVar2 + fVar28;
      fVar29 = pfVar20[0x14] * fVar4 + pfVar20[6] * fVar2 + fVar29;
      fVar30 = pfVar20[0x15] * fVar5 + pfVar20[7] * fVar3 + fVar30;
      fVar31 = pfVar20[0x16] * fVar5 + pfVar20[8] * fVar3 + fVar31;
      fVar32 = pfVar20[0x17] * fVar5 + pfVar20[9] * fVar3 + fVar32;
      fVar33 = pfVar20[0x18] * fVar5 + pfVar20[10] * fVar3 + fVar33;
      fVar34 = pfVar20[0x18] * fVar5 + fVar3 * pfVar20[10] + fVar34;
      fVar35 = pfVar20[0x19] * fVar5 + fVar3 * pfVar20[0xb] + fVar35;
      fVar36 = pfVar20[0x1a] * fVar5 + fVar3 * pfVar20[0xc] + fVar36;
      fVar37 = pfVar20[0x1b] * fVar5 + fVar3 * pfVar20[0xd] + fVar37;
      iVar17 = iVar17 + -1;
      pfVar21 = pfVar21 + 4;
      pfVar16 = pfVar20 + 0x1c;
    } while (1 < iVar17);
    fVar38 = (float)*(undefined8 *)pfVar21;
    fVar39 = (float)((ulong)*(undefined8 *)pfVar21 >> 0x20);
    fVar2 = pfVar20[0x1c];
    fVar3 = pfVar20[0x1d];
    fVar4 = pfVar20[0x1e];
    fVar5 = pfVar20[0x1f];
    fVar6 = pfVar20[0x20];
    fVar7 = pfVar20[0x21];
    fVar8 = pfVar20[0x22];
    fVar9 = pfVar20[0x23];
    fVar10 = pfVar20[0x24];
    fVar11 = pfVar20[0x25];
    fVar12 = pfVar20[0x26];
    fVar13 = pfVar20[0x27];
    fVar14 = pfVar20[0x28];
    fVar15 = pfVar20[0x29];
    output_buffer[3] = fVar34 + pfVar20[0x26] * fVar39 + fVar26 + pfVar20[0x1f] * fVar38;
    output_buffer[4] = fVar35 + fVar13 * fVar39 + fVar27 + fVar6 * fVar38;
    output_buffer[5] = fVar36 + fVar14 * fVar39 + fVar28 + fVar7 * fVar38;
    output_buffer[6] = fVar37 + fVar15 * fVar39 + fVar29 + fVar8 * fVar38;
    *output_buffer = fVar30 + fVar9 * fVar39 + fVar22 + fVar2 * fVar38;
    output_buffer[1] = fVar31 + fVar10 * fVar39 + fVar23 + fVar3 * fVar38;
    output_buffer[2] = fVar32 + fVar11 * fVar39 + fVar24 + fVar4 * fVar38;
    output_buffer[3] = fVar33 + fVar12 * fVar39 + fVar25 + fVar5 * fVar38;
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar18 = pfVar18 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod2 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 6 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__2_coeff_remnant( 4 );

    stbir__store_output();
  } while ( output < output_end );
}